

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

int nghttp2_bufs_orb(nghttp2_bufs *bufs,uint8_t b)

{
  int iVar1;
  nghttp2_buf_chain *pnVar2;
  byte *pbVar3;
  
  pnVar2 = bufs->cur;
  pbVar3 = (pnVar2->buf).last;
  if ((pnVar2->buf).end == pbVar3) {
    iVar1 = bufs_alloc_chain(bufs);
    if (iVar1 != 0) {
      return iVar1;
    }
    pnVar2 = bufs->cur;
    pbVar3 = (pnVar2->buf).last;
  }
  (pnVar2->buf).last = pbVar3 + 1;
  *pbVar3 = *pbVar3 | b;
  return 0;
}

Assistant:

int nghttp2_bufs_orb(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

#ifdef __clang_analyzer__
  assert(bufs->cur->buf.last);
#endif

  *bufs->cur->buf.last++ |= b;

  return 0;
}